

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::ensureLayout(QInputDialogPrivate *this)

{
  QLabel *pQVar1;
  QInputDialogPrivate *this_00;
  QVBoxLayout *pQVar2;
  QInputDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QInputDialog *q;
  Policy in_stack_fffffffffffffee8;
  undefined4 uVar3;
  Policy in_stack_fffffffffffffeec;
  enum_type in_stack_fffffffffffffef0;
  enum_type in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QLabel *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  QFlagsStorage<QDialogButtonBox::StandardButton> buttons;
  Connection *this_01;
  QInputDialogPrivate *in_stack_ffffffffffffff20;
  offset_in_QDialog_to_subr *in_stack_ffffffffffffff30;
  QWidget *in_stack_ffffffffffffff38;
  QLabel *in_stack_ffffffffffffff40;
  offset_in_QDialogButtonBox_to_subr in_stack_ffffffffffffff60;
  ConnectionType in_stack_ffffffffffffff80;
  undefined1 local_64 [4];
  undefined1 local_60 [4];
  undefined1 local_5c [4];
  undefined8 local_58;
  undefined8 local_50;
  Connection local_48;
  undefined8 local_40;
  undefined8 local_38;
  Connection local_30;
  undefined1 local_24 [28];
  long local_8;
  
  buttons.i = (Int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->mainLayout == (QVBoxLayout *)0x0) {
    if (in_RDI->inputWidget == (QWidget *)0x0) {
      ensureLineEdit(in_stack_ffffffffffffff20);
      in_RDI->inputWidget = &in_RDI->lineEdit->super_QWidget;
    }
    if (in_RDI->label == (QLabel *)0x0) {
      pQVar1 = (QLabel *)operator_new(0x28);
      QInputDialog::tr((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffeec);
      memset(local_24,0,4);
      QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x79a78e);
      QLabel::QLabel(in_stack_ffffffffffffff00,
                     (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (WindowFlags)buttons.i);
      in_RDI->label = pQVar1;
      QString::~QString((QString *)0x79a7ca);
    }
    QLabel::setBuddy(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    alignment.i = Horizontal;
    QWidget::setSizePolicy
              ((QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
    this_00 = (QInputDialogPrivate *)operator_new(0x28);
    ::operator|(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
    QDialogButtonBox::QDialogButtonBox
              ((QDialogButtonBox *)this_00,(StandardButtons)buttons.i,alignment.i,
               (QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    in_RDI->buttonBox = (QDialogButtonBox *)this_00;
    local_38 = 0;
    local_40 = 0x1b9;
    this_01 = &local_30;
    QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
              ((Object *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff60,
               (ContextType *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff80);
    QMetaObject::Connection::~Connection(this_01);
    local_50 = 0;
    local_58 = 0x1c1;
    uVar3 = 0;
    QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
              ((Object *)in_stack_ffffffffffffff40,
               (offset_in_QDialogButtonBox_to_subr)QDialogButtonBox::rejected,
               (ContextType *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff80);
    QMetaObject::Connection::~Connection(&local_48);
    pQVar2 = (QVBoxLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout
              ((QVBoxLayout *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (QWidget *)CONCAT44(in_stack_fffffffffffffeec,uVar3));
    in_RDI->mainLayout = pQVar2;
    QLayout::setSizeConstraint((QLayout *)this_00,alignment.i);
    memset(local_5c,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x79a9cb);
    QBoxLayout::addWidget
              ((QBoxLayout *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (QWidget *)CONCAT44(in_stack_fffffffffffffeec,uVar3),0,(Alignment)alignment.i);
    memset(local_60,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x79aa21);
    QBoxLayout::addWidget
              ((QBoxLayout *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (QWidget *)CONCAT44(in_stack_fffffffffffffeec,uVar3),0,(Alignment)alignment.i);
    memset(local_64,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x79aa77);
    QBoxLayout::addWidget
              ((QBoxLayout *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (QWidget *)CONCAT44(in_stack_fffffffffffffeec,uVar3),0,(Alignment)alignment.i);
    qobject_cast<QAbstractSpinBox*>((QObject *)0x79aaa0);
    ensureEnabledConnection
              (this_00,(QAbstractSpinBox *)CONCAT44(alignment.i,in_stack_fffffffffffffef8));
    QWidget::show((QWidget *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDialogPrivate::ensureLayout()
{
    Q_Q(QInputDialog);

    if (mainLayout)
        return;

    if (!inputWidget) {
        ensureLineEdit();
        inputWidget = lineEdit;
    }

    if (!label)
        label = new QLabel(QInputDialog::tr("Enter a value:"), q);
#ifndef QT_NO_SHORTCUT
    label->setBuddy(inputWidget);
#endif
    label->setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed);

    buttonBox = new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel, Qt::Horizontal, q);
    QObject::connect(buttonBox, &QDialogButtonBox::accepted, q, &QDialog::accept);
    QObject::connect(buttonBox, &QDialogButtonBox::rejected, q, &QDialog::reject);

    mainLayout = new QVBoxLayout(q);
    mainLayout->setSizeConstraint(QLayout::SetMinAndMaxSize);
    mainLayout->addWidget(label);
    mainLayout->addWidget(inputWidget);
    mainLayout->addWidget(buttonBox);
    ensureEnabledConnection(qobject_cast<QAbstractSpinBox *>(inputWidget));
    inputWidget->show();
}